

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

EnvironmentType StrToEnvironmentType(char *str)

{
  int iVar1;
  char *in_RDI;
  EnvironmentType local_4;
  
  iVar1 = strcmp(in_RDI,"2d");
  if (iVar1 == 0) {
    local_4 = ENV_TYPE_2D;
  }
  else {
    iVar1 = strcmp(in_RDI,"2duu");
    if (iVar1 == 0) {
      local_4 = ENV_TYPE_2DUU;
    }
    else {
      iVar1 = strcmp(in_RDI,"xytheta");
      if (iVar1 == 0) {
        local_4 = ENV_TYPE_XYTHETA;
      }
      else {
        iVar1 = strcmp(in_RDI,"xythetamlev");
        if (iVar1 == 0) {
          local_4 = ENV_TYPE_XYTHETAMLEV;
        }
        else {
          iVar1 = strcmp(in_RDI,"robarm");
          if (iVar1 == 0) {
            local_4 = ENV_TYPE_ROBARM;
          }
          else {
            local_4 = INVALID_ENV_TYPE;
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

EnvironmentType StrToEnvironmentType(const char* str)
{
    if (!strcmp(str, "2d")) {
        return ENV_TYPE_2D;
    }
    else if (!strcmp(str, "2duu")) {
        return ENV_TYPE_2DUU;
    }
    else if (!strcmp(str, "xytheta")) {
        return ENV_TYPE_XYTHETA;
    }
    else if (!strcmp(str, "xythetamlev")) {
        return ENV_TYPE_XYTHETAMLEV;
    }
    else if (!strcmp(str, "robarm")) {
        return ENV_TYPE_ROBARM;
    }
    else {
        return INVALID_ENV_TYPE;
    }
}